

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example_table.c
# Opt level: O2

void delete_example_table_content(ExampleTable *example_table)

{
  free(example_table->id);
  free(example_table->keyword);
  free(example_table->name);
  free(example_table->description);
  if (example_table->tags != (Tags *)0x0) {
    Tags_delete(example_table->tags);
  }
  if (example_table->table_header != (TableRow *)0x0) {
    TableRow_delete(example_table->table_header);
  }
  if (example_table->table_body != (TableRows *)0x0) {
    TableRows_delete(example_table->table_body);
    return;
  }
  return;
}

Assistant:

static void delete_example_table_content(const ExampleTable* example_table) {
    if (example_table->id) {
        free((void*)example_table->id);
    }
    if (example_table->keyword) {
        free((void*)example_table->keyword);
    }
    if (example_table->name) {
        free((void*)example_table->name);
    }
    if (example_table->description) {
        free((void*)example_table->description);
    }
    if (example_table->tags) {
        Tags_delete(example_table->tags);
    }
    if (example_table->table_header) {
        TableRow_delete(example_table->table_header);
    }
    if (example_table->table_body) {
        TableRows_delete(example_table->table_body);
    }
}